

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O0

void clear_ech(st_ptls_ech_t *ech,int is_server)

{
  ptls_iovec_t pVar1;
  uint8_t *local_38;
  size_t local_30;
  uint8_t *local_28;
  size_t local_20;
  int is_server_local;
  st_ptls_ech_t *ech_local;
  
  if (ech->aead != (ptls_aead_context_t *)0x0) {
    ptls_aead_free(ech->aead);
    ech->aead = (ptls_aead_context_t *)0x0;
  }
  (*ptls_clear_memory)(ech->inner_client_random,0x20);
  if (is_server == 0) {
    free((ech->client).enc.base);
    pVar1 = ptls_iovec_init((void *)0x0,0);
    local_28 = pVar1.base;
    (ech->client).enc.base = local_28;
    local_20 = pVar1.len;
    (ech->client).enc.len = local_20;
    if ((ech->client).public_name != (char *)0x0) {
      free((ech->client).public_name);
      (ech->client).public_name = (char *)0x0;
    }
    free((ech->client).first_ech.base);
    pVar1 = ptls_iovec_init((void *)0x0,0);
    local_38 = pVar1.base;
    (ech->client).first_ech.base = local_38;
    local_30 = pVar1.len;
    (ech->client).first_ech.len = local_30;
  }
  return;
}

Assistant:

static void clear_ech(struct st_ptls_ech_t *ech, int is_server)
{
    if (ech->aead != NULL) {
        ptls_aead_free(ech->aead);
        ech->aead = NULL;
    }
    ptls_clear_memory(ech->inner_client_random, PTLS_HELLO_RANDOM_SIZE);
    if (!is_server) {
        free(ech->client.enc.base);
        ech->client.enc = ptls_iovec_init(NULL, 0);
        if (ech->client.public_name != NULL) {
            free(ech->client.public_name);
            ech->client.public_name = NULL;
        }
        free(ech->client.first_ech.base);
        ech->client.first_ech = ptls_iovec_init(NULL, 0);
    }
}